

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::anon_unknown_7::TileBuffer::~TileBuffer(TileBuffer *this)

{
  long in_RDI;
  Array<char> *in_stack_ffffffffffffffe0;
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (*(long **)(in_RDI + 0x28) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 8))();
  }
  if ((*(long *)(in_RDI + 0x50) != 0) &&
     (in_stack_ffffffffffffffe0 = *(Array<char> **)(in_RDI + 0x50),
     in_stack_ffffffffffffffe0 != (Array<char> *)0x0)) {
    (**(code **)(in_stack_ffffffffffffffe0->_size + 8))();
  }
  IlmThread_3_3::Semaphore::~Semaphore((Semaphore *)0x1b8299);
  std::__cxx11::string::~string((string *)(in_RDI + 0x70));
  Array<char>::~Array(in_stack_ffffffffffffffe0);
  Array<char>::~Array(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

TileBuffer::~TileBuffer ()
{
    if (compressor != 0) delete compressor;

    if (sampleCountTableCompressor != 0) delete sampleCountTableCompressor;
}